

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O3

void __thiscall FrameProtector::~FrameProtector(FrameProtector *this)

{
  Frame *pFVar1;
  pointer ptVar2;
  pointer ptVar3;
  
  if (g_current_frame == (Frame *)0x0) {
    __assert_fail("g_current_frame != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h"
                  ,0x5f,"FrameProtector::~FrameProtector()");
  }
  g_current_frame = g_current_frame->parent;
  if (g_current_frame != (Frame *)0x0) {
    pFVar1 = this->protected_frame;
    if (pFVar1 != (Frame *)0x0) {
      ptVar2 = (pFVar1->vector_roots).
               super__Vector_base<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>,_std::allocator<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (ptVar2 != (pointer)0x0) {
        operator_delete(ptVar2,(long)(pFVar1->vector_roots).
                                     super__Vector_base<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>,_std::allocator<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ptVar2);
      }
      ptVar3 = (pFVar1->roots).
               super__Vector_base<std::tuple<const_char_*,_Sexp_**>,_std::allocator<std::tuple<const_char_*,_Sexp_**>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (ptVar3 != (pointer)0x0) {
        operator_delete(ptVar3,(long)(pFVar1->roots).
                                     super__Vector_base<std::tuple<const_char_*,_Sexp_**>,_std::allocator<std::tuple<const_char_*,_Sexp_**>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ptVar3);
      }
    }
    operator_delete(pFVar1,0x40);
    return;
  }
  __assert_fail("g_current_frame != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h",
                0x61,"FrameProtector::~FrameProtector()");
}

Assistant:

~FrameProtector() {
    assert(g_current_frame != nullptr);
    g_current_frame = g_current_frame->GetParent();
    assert(g_current_frame != nullptr);
    delete protected_frame;
  }